

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickle_event.c
# Opt level: O1

void PickleEvent_print(Event *event,FILE *file)

{
  if ((event != (Event *)0x0) && (event->event_type == Gherkin_PickleEvent)) {
    fwrite("{\"pickle\":",10,1,(FILE *)file);
    PicklePrinter_print_pickle((FILE_conflict *)file,(Pickle *)event[1].event_print);
    fwrite("}\n",2,1,(FILE *)file);
    return;
  }
  return;
}

Assistant:

static void PickleEvent_print(const Event* event, FILE* file) {
    if (!event || event->event_type != Gherkin_PickleEvent) {
        return;
    }
    const PickleEvent* pickle_event = (const PickleEvent*) event;
    if (pickle_event) {
        fprintf(file, "{\"pickle\":");
        PicklePrinter_print_pickle(file, pickle_event->pickle);
        fprintf(file, "}\n");
    }
}